

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::AddRegConstCommand::processMemoryTemps
          (AddRegConstCommand *this,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared,
          AssemblyCommands *newAssemblyCommands,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *spilledToOffset,CTemp *beginSP)

{
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &thisShared->
              super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>);
  onlyLeftProcessMemoryTemps
            (newAssemblyCommands,spilledToOffset,beginSP,
             (shared_ptr<AssemblyCode::AssemblyCommand> *)&local_38,&this->leftOperand,true,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void AssemblyCode::AddRegConstCommand::processMemoryTemps( std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                                           AssemblyCommands &newAssemblyCommands,
                                                           std::map<std::string, int> &spilledToOffset,
                                                           IRT::CTemp &beginSP ) {

    onlyLeftProcessMemoryTemps(newAssemblyCommands, spilledToOffset, beginSP,
                                thisShared, leftOperand, /* load left */ true, /* store left */ true);

}